

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkt-proc-builder.cpp
# Opt level: O2

void __thiscall yactfr::internal::InstrFinder::visit(InstrFinder *this,BeginReadSlArrayInstr *instr)

{
  if ((this->_findWithMetadataStreamUuidRole == true) &&
     (*(char *)&(instr->super_BeginReadCompoundInstr).super_ReadDataInstr._dt[2]._vptr_DataType ==
      '\x01')) {
    std::function<void_(yactfr::internal::InstrLoc_&)>::operator()
              (&this->_func,&(this->super_CallerInstrVisitor)._curInstrLoc);
  }
  CallerInstrVisitor::_visitProc
            (&this->super_CallerInstrVisitor,&(instr->super_BeginReadCompoundInstr)._proc);
  return;
}

Assistant:

void visit(BeginReadSlArrayInstr& instr) override
    {
        if (_findWithMetadataStreamUuidRole && instr.slArrayType().hasMetadataStreamUuidRole()) {
            _func(_curInstrLoc);
        }

        this->_visit(instr);
    }